

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

int xmlCatalogAdd(xmlChar *type,xmlChar *orig,xmlChar *replace)

{
  int iVar1;
  xmlCatalogEntryPtr pxVar2;
  int res;
  xmlChar *replace_local;
  xmlChar *orig_local;
  xmlChar *type_local;
  
  xmlInitParser();
  xmlRMutexLock(&xmlCatalogMutex);
  if ((xmlDefaultCatalog == (xmlCatalogPtr)0x0) && (iVar1 = xmlStrEqual(type,"catalog"), iVar1 != 0)
     ) {
    xmlDefaultCatalog = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,xmlCatalogDefaultPrefer);
    if (xmlDefaultCatalog != (xmlCatalogPtr)0x0) {
      pxVar2 = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,orig,(xmlChar *)0x0,
                                  xmlCatalogDefaultPrefer,(xmlCatalogEntryPtr)0x0);
      xmlDefaultCatalog->xml = pxVar2;
    }
    xmlRMutexUnlock(&xmlCatalogMutex);
    xmlCatalogInitialized = 1;
    return 0;
  }
  iVar1 = xmlACatalogAdd(xmlDefaultCatalog,type,orig,replace);
  xmlRMutexUnlock(&xmlCatalogMutex);
  return iVar1;
}

Assistant:

int
xmlCatalogAdd(const xmlChar *type, const xmlChar *orig, const xmlChar *replace) {
    int res = -1;

    xmlInitParser();

    xmlRMutexLock(&xmlCatalogMutex);
    /*
     * Specific case where one want to override the default catalog
     * put in place by xmlInitializeCatalog();
     */
    if ((xmlDefaultCatalog == NULL) &&
	(xmlStrEqual(type, BAD_CAST "catalog"))) {
	xmlDefaultCatalog = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,
		                          xmlCatalogDefaultPrefer);
	if (xmlDefaultCatalog != NULL) {
	   xmlDefaultCatalog->xml = xmlNewCatalogEntry(XML_CATA_CATALOG, NULL,
				    orig, NULL,  xmlCatalogDefaultPrefer, NULL);
	}
	xmlRMutexUnlock(&xmlCatalogMutex);
        xmlCatalogInitialized = 1;
	return(0);
    }

    res = xmlACatalogAdd(xmlDefaultCatalog, type, orig, replace);
    xmlRMutexUnlock(&xmlCatalogMutex);
    return(res);
}